

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::CreateView
          (Relation *this,string *schema_name,string *name,bool replace,bool temporary)

{
  Relation *pRVar1;
  pointer pQVar2;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar3;
  shared_ptr<duckdb::CreateViewRelation,_true> view;
  string prepended_message;
  bool local_91;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_90;
  Relation *local_88;
  shared_ptr<duckdb::CreateViewRelation,_true> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_91 = temporary;
  local_88 = this;
  enable_shared_from_this<duckdb::Relation>::shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)&local_70);
  make_shared_ptr<duckdb::CreateViewRelation,duckdb::shared_ptr<duckdb::Relation,true>,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,bool&>
            ((shared_ptr<duckdb::Relation,_true> *)&local_80,&local_70,name,
             (bool *)CONCAT71(in_register_00000009,replace),&local_91);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
  shared_ptr<duckdb::CreateViewRelation,_true>::operator->(&local_80);
  Execute((Relation *)&local_90);
  pQVar2 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)&local_90);
  pRVar1 = local_88;
  if ((pQVar2->super_BaseQueryResult).success != false) {
    enable_shared_from_this<duckdb::Relation>::shared_from_this
              ((enable_shared_from_this<duckdb::Relation> *)local_88);
    if (local_90._M_head_impl != (QueryResult *)0x0) {
      (*((local_90._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult[1])();
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.internal.
                super___shared_ptr<duckdb::CreateViewRelation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pRVar1;
    return (shared_ptr<duckdb::Relation,_true>)
           sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::operator+(&local_50,"Failed to create view \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(in_register_00000009,replace));
  ::std::operator+(&local_70,&local_50,"\': ");
  ::std::__cxx11::string::~string((string *)&local_50);
  pQVar2 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)&local_90);
  BaseQueryResult::ThrowError(&pQVar2->super_BaseQueryResult,&local_70);
}

Assistant:

shared_ptr<Relation> Relation::CreateView(const string &schema_name, const string &name, bool replace, bool temporary) {
	auto view = make_shared_ptr<CreateViewRelation>(shared_from_this(), schema_name, name, replace, temporary);
	auto res = view->Execute();
	if (res->HasError()) {
		const string prepended_message = "Failed to create view '" + name + "': ";
		res->ThrowError(prepended_message);
	}
	return shared_from_this();
}